

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O2

FSerializer * Serialize(FSerializer *arc,char *key,sector_t_conflict *p,sector_t_conflict *def)

{
  TVector2<double> *pTVar1;
  bool bVar2;
  FSerializer *pFVar3;
  TVector2<double> local_58;
  TVector2<double> local_48;
  
  local_58.X = 0.0;
  local_58.Y = 0.0;
  local_48.X = 0.0;
  local_48.Y = 0.0;
  if ((arc->w != (FWriter *)0x0) && (level.Scrolls.Count != 0)) {
    local_58.X = level.Scrolls.Array[p->sectornum].X;
    local_58.Y = level.Scrolls.Array[p->sectornum].Y;
  }
  bVar2 = FSerializer::BeginObject(arc,key);
  if (bVar2) {
    pFVar3 = FSerializer::operator()(arc,"floorplane",&p->floorplane,&def->floorplane);
    pFVar3 = FSerializer::operator()(pFVar3,"ceilingplane",&p->ceilingplane,&def->ceilingplane);
    pFVar3 = FSerializer::operator()(pFVar3,"lightlevel",&p->lightlevel,&def->lightlevel);
    pFVar3 = FSerializer::operator()(pFVar3,"special",&p->special,&def->special);
    pFVar3 = FSerializer::operator()(pFVar3,"seqtype",&p->seqType,&def->seqType);
    pFVar3 = FSerializer::operator()(pFVar3,"seqname",&p->SeqName,&def->SeqName);
    pFVar3 = FSerializer::operator()(pFVar3,"friction",&p->friction,&def->friction);
    pFVar3 = FSerializer::operator()(pFVar3,"movefactor",&p->movefactor,&def->movefactor);
    pFVar3 = FSerializer::operator()(pFVar3,"stairlock",&p->stairlock,&def->stairlock);
    pFVar3 = FSerializer::operator()(pFVar3,"prevsec",&p->prevsec,&def->prevsec);
    pFVar3 = FSerializer::operator()(pFVar3,"nextsec",&p->nextsec,&def->nextsec);
    pFVar3 = FSerializer::Array<sector_t::splane>(pFVar3,"planes",p->planes,def->planes,2,true);
    pFVar3 = FSerializer::operator()(pFVar3,"damageamount",&p->damageamount,&def->damageamount);
    pFVar3 = FSerializer::operator()
                       (pFVar3,"damageinterval",&p->damageinterval,&def->damageinterval);
    pFVar3 = FSerializer::operator()(pFVar3,"leakydamage",&p->leakydamage,&def->leakydamage);
    pFVar3 = FSerializer::operator()(pFVar3,"damagetype",&p->damagetype,&def->damagetype);
    pFVar3 = FSerializer::operator()(pFVar3,"sky",&p->sky,&def->sky);
    pFVar3 = FSerializer::operator()(pFVar3,"moreflags",&p->MoreFlags,&def->MoreFlags);
    pFVar3 = FSerializer::operator()(pFVar3,"flags",&p->Flags,&def->Flags);
    pFVar3 = FSerializer::Array<unsigned_int>(pFVar3,"portals",p->Portals,def->Portals,2,true);
    pFVar3 = FSerializer::operator()(pFVar3,"zonenumber",&p->ZoneNumber,&def->ZoneNumber);
    pFVar3 = FSerializer::Array<TObjPtr<DInterpolation>>
                       (pFVar3,"interpolations",p->interpolations,4,true);
    pFVar3 = FSerializer::operator()(pFVar3,"soundtarget",&p->SoundTarget);
    pFVar3 = FSerializer::operator()(pFVar3,"secacttarget",&p->SecActTarget);
    pFVar3 = FSerializer::operator()(pFVar3,"floordata",&p->floordata);
    pFVar3 = FSerializer::operator()(pFVar3,"ceilingdata",&p->ceilingdata);
    pFVar3 = FSerializer::operator()(pFVar3,"lightingdata",&p->lightingdata);
    pFVar3 = FSerializer::operator()
                       (pFVar3,"fakefloor_sectors",(TArray<sector_t_*,_sector_t_*> *)p->e);
    pFVar3 = FSerializer::operator()(pFVar3,"midtexf_lines",&(p->e->Midtex).Floor.AttachedLines);
    pFVar3 = FSerializer::operator()
                       (pFVar3,"midtexf_sectors",(TArray<sector_t_*,_sector_t_*> *)&p->e->Midtex);
    pFVar3 = FSerializer::operator()(pFVar3,"midtexc_lines",&(p->e->Midtex).Ceiling.AttachedLines);
    pFVar3 = FSerializer::operator()
                       (pFVar3,"midtexc_sectors",&(p->e->Midtex).Ceiling.AttachedSectors);
    pFVar3 = FSerializer::operator()
                       (pFVar3,"linked_floor",(TArray<FLinkedSector,_FLinkedSector> *)&p->e->Linked)
    ;
    pFVar3 = FSerializer::operator()(pFVar3,"linked_ceiling",&(p->e->Linked).Ceiling.Sectors);
    pFVar3 = FSerializer::operator()(pFVar3,"colormap",&p->ColorMap,&def->ColorMap);
    pFVar3 = FSerializer::Terrain(pFVar3,"floorterrain",p->terrainnum,def->terrainnum);
    pFVar3 = FSerializer::Terrain(pFVar3,"ceilingterrain",p->terrainnum + 1,def->terrainnum + 1);
    pFVar3 = FSerializer::operator()(pFVar3,"scrolls",&local_58,&local_48);
    FSerializer::EndObject(pFVar3);
    if (((arc->r != (FReader *)0x0) && (local_58.Y != 0.0 || local_58.X != 0.0)) &&
       (level.Scrolls.Count == 0)) {
      TArray<TVector2<double>,_TVector2<double>_>::Resize(&level.Scrolls,numsectors);
      memset(level.Scrolls.Array,0,(ulong)level.Scrolls.Count << 4);
      pTVar1 = level.Scrolls.Array + p->sectornum;
      pTVar1->X = local_58.X;
      pTVar1->Y = local_58.Y;
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, sector_t &p, sector_t *def)
{
	// save the Scroll data here because it's a lot easier to handle a default.
	// Just writing out the full array can massively inflate the archive for no gain.
	DVector2 scroll = { 0,0 }, nul = { 0,0 };
	if (arc.isWriting() && level.Scrolls.Size() > 0) scroll = level.Scrolls[p.sectornum];

	if (arc.BeginObject(key))
	{
		arc("floorplane", p.floorplane, def->floorplane)
			("ceilingplane", p.ceilingplane, def->ceilingplane)
			("lightlevel", p.lightlevel, def->lightlevel)
			("special", p.special, def->special)
			("seqtype", p.seqType, def->seqType)
			("seqname", p.SeqName, def->SeqName)
			("friction", p.friction, def->friction)
			("movefactor", p.movefactor, def->movefactor)
			("stairlock", p.stairlock, def->stairlock)
			("prevsec", p.prevsec, def->prevsec)
			("nextsec", p.nextsec, def->nextsec)
			.Array("planes", p.planes, def->planes, 2, true)
			// These cannot change during play.
			//("heightsec", p.heightsec)
			//("bottommap", p.bottommap)
			//("midmap", p.midmap)
			//("topmap", p.topmap)
			("damageamount", p.damageamount, def->damageamount)
			("damageinterval", p.damageinterval, def->damageinterval)
			("leakydamage", p.leakydamage, def->leakydamage)
			("damagetype", p.damagetype, def->damagetype)
			("sky", p.sky, def->sky)
			("moreflags", p.MoreFlags, def->MoreFlags)
			("flags", p.Flags, def->Flags)
			.Array("portals", p.Portals, def->Portals, 2, true)
			("zonenumber", p.ZoneNumber, def->ZoneNumber)
			.Array("interpolations", p.interpolations, 4, true)
			("soundtarget", p.SoundTarget)
			("secacttarget", p.SecActTarget)
			("floordata", p.floordata)
			("ceilingdata", p.ceilingdata)
			("lightingdata", p.lightingdata)
			("fakefloor_sectors", p.e->FakeFloor.Sectors)
			("midtexf_lines", p.e->Midtex.Floor.AttachedLines)
			("midtexf_sectors", p.e->Midtex.Floor.AttachedSectors)
			("midtexc_lines", p.e->Midtex.Ceiling.AttachedLines)
			("midtexc_sectors", p.e->Midtex.Ceiling.AttachedSectors)
			("linked_floor", p.e->Linked.Floor.Sectors)
			("linked_ceiling", p.e->Linked.Ceiling.Sectors)
			("colormap", p.ColorMap, def->ColorMap)
			.Terrain("floorterrain", p.terrainnum[0], &def->terrainnum[0])
			.Terrain("ceilingterrain", p.terrainnum[1], &def->terrainnum[1])
			("scrolls", scroll, nul)
			.EndObject();

		if (arc.isReading() && !scroll.isZero())
		{
			if (level.Scrolls.Size() == 0)
			{
				level.Scrolls.Resize(numsectors);
				memset(&level.Scrolls[0], 0, sizeof(level.Scrolls[0])*level.Scrolls.Size());
				level.Scrolls[p.sectornum] = scroll;
			}
		}
	}
	return arc;
}